

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QRect __thiscall
QStyleSheetStyle::subControlRect
          (QStyleSheetStyle *this,ComplexControl cc,QStyleOptionComplex *opt,SubControl sc,
          QWidget *w)

{
  QRect *pQVar1;
  SubControl SVar2;
  Int IVar3;
  undefined1 auVar4 [16];
  Int IVar5;
  QStyleSheetStyle *pQVar6;
  QSharedDataPointer<QStyleSheetGeometryData> QVar7;
  bool bVar8;
  uint uVar9;
  uint uVar14;
  QStyle *pQVar15;
  int iVar10;
  int iVar11;
  int iVar12;
  QSize QVar16;
  QSize QVar17;
  QRenderRule *pQVar18;
  Representation RVar13;
  QStyleSheetGeometryData *ptr;
  QStyleSheetPositionData *ptr_00;
  undefined8 uVar19;
  uint uVar20;
  Representation RVar21;
  ulong uVar22;
  long lVar23;
  int extraout_EDX;
  int extraout_EDX_00;
  Origin OVar24;
  ulong uVar25;
  Representation RVar26;
  QVariant *val;
  QVariant *pQVar27;
  Representation RVar28;
  uint uVar29;
  long lVar30;
  Int IVar31;
  Representation RVar32;
  undefined8 *puVar33;
  LayoutDirection LVar34;
  Int min;
  Representation RVar35;
  QStyleOptionComplex *pQVar36;
  Representation RVar37;
  uint uVar38;
  int iVar39;
  Representation RVar40;
  uint range;
  Representation RVar41;
  int iVar42;
  uint uVar43;
  long in_FS_OFFSET;
  bool bVar44;
  byte bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  QRect QVar49;
  QRect QVar50;
  QRect QVar51;
  QRect QVar52;
  QByteArrayView layout;
  QRenderRule downRule;
  QRenderRule rule;
  QRenderRule upRule;
  QRect local_298;
  SubControl local_27c;
  undefined1 local_278 [12];
  Representation RStack_26c;
  undefined1 local_268 [16];
  undefined1 *local_258;
  QPalettePrivate *pQStack_250;
  undefined1 *local_248;
  QObject *pQStack_240;
  undefined1 *local_238;
  undefined1 *puStack_230;
  Data *local_228;
  undefined1 local_1e8 [12];
  Representation RStack_1dc;
  QRect local_1d8;
  QSharedDataPointer<QStyleSheetBoxData> local_1b0;
  QSharedDataPointer<QStyleSheetBackgroundData> local_1a8;
  QSharedDataPointer<QStyleSheetBorderData> local_1a0;
  QSharedDataPointer<QStyleSheetOutlineData> QStack_198;
  QSharedDataPointer<QStyleSheetGeometryData> local_190;
  QSharedDataPointer<QStyleSheetPositionData> QStack_188;
  QSharedDataPointer<QStyleSheetImageData> local_180;
  QSharedDataPointer<QStyleSheetImageData> QStack_178;
  ulong local_170;
  QRenderRule local_160;
  undefined1 local_d8 [56];
  QSharedDataPointer<QStyleSheetBoxData> local_a0;
  QSharedDataPointer<QStyleSheetBorderData> local_90;
  QSize local_80;
  QSharedDataPointer<QStyleSheetPositionData> local_78;
  QSharedDataPointer<QStyleSheetImageData> local_70 [7];
  long local_38;
  
  pQVar6 = globalStyleSheetStyle;
  bVar45 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_27c = sc;
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar15 = baseStyle(this);
    QVar49 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))(pQVar15,cc,opt,sc,w);
    uVar22 = QVar49._0_8_;
    goto LAB_00367686;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&local_160,0xaa,0x88);
  renderRule(&local_160,this,&w->super_QObject,&opt->super_QStyleOption,0);
  switch(cc) {
  case CC_SpinBox:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       ((opt->super_QStyleOption).type != 0xf0002)) break;
    memset((QRenderRule *)local_d8,0xaa,0x88);
    renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0xb);
    memset((QRenderRule *)local_1e8,0xaa,0x88);
    renderRule((QRenderRule *)local_1e8,this,&w->super_QObject,&opt->super_QStyleOption,0xd);
    bVar44 = true;
    bVar8 = true;
    if (local_160.b.d.ptr == (QStyleSheetBoxData *)0x0) {
      if (local_160.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
        bVar8 = false;
      }
      else {
        bVar8 = true;
        if ((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_160.bd.d.ptr + 0x68))->
            d).ptr == (QStyleSheetBorderImageData *)0x0) {
          bVar8 = *(BorderStyle *)((long)local_160.bd.d.ptr + 0x38) != BorderStyle_Native;
        }
      }
    }
    if ((local_190.d.ptr != (QStyleSheetGeometryData *)0x0) ||
       (bVar44 = QStack_188.d.ptr != (QStyleSheetPositionData *)0x0,
       (bool)(bVar8 | (local_80 != (QSize)0x0 || local_78.d.ptr != (QStyleSheetPositionData *)0x0) |
             bVar44))) {
      switch(sc) {
      case SC_ComboBoxFrame:
        if (local_80 == (QSize)0x0 && local_78.d.ptr == (QStyleSheetPositionData *)0x0)
        goto switchD_00366e60_caseD_3;
        LVar34 = (opt->super_QStyleOption).direction;
        pQVar18 = (QRenderRule *)local_d8;
        iVar10 = 0xb;
LAB_00367ddf:
        QVar51 = positionRect(this,w,&local_160,pQVar18,iVar10,&(opt->super_QStyleOption).rect,
                              LVar34);
        break;
      case SC_ComboBoxEditField:
        if (bVar44) {
          LVar34 = (opt->super_QStyleOption).direction;
          pQVar18 = (QRenderRule *)local_1e8;
          iVar10 = 0xd;
          goto LAB_00367ddf;
        }
      default:
switchD_00366e60_caseD_3:
        pQVar15 = baseStyle(this);
        QVar51 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))(pQVar15,0,opt,sc,w);
        break;
      case SC_ComboBoxArrow:
        QVar51 = QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
        break;
      case SC_ComboBoxListBoxPopup:
        QVar49 = QRenderRule::contentsRect(&local_160,&(opt->super_QStyleOption).rect);
        if (local_78.d.ptr == (QStyleSheetPositionData *)0x0) {
          uVar9 = 2;
        }
        else {
          uVar9 = (((Alignment *)((long)local_78.d.ptr + 0x18))->
                  super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                  super_QFlagsStorage<Qt::AlignmentFlag>.i;
        }
        LVar34 = (opt->super_QStyleOption).direction;
        uVar20 = uVar9;
        if (((LVar34 != LeftToRight) && ((uVar9 & 0x10) == 0)) &&
           ((uVar20 = 2, (uVar9 & 1) == 0 && (uVar20 = 1, (uVar9 & 2) == 0)))) {
          uVar20 = uVar9;
        }
        if (QStack_188.d.ptr == (QStyleSheetPositionData *)0x0) {
          uVar9 = 2;
        }
        else {
          uVar9 = (((Alignment *)((long)QStack_188.d.ptr + 0x18))->
                  super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                  super_QFlagsStorage<Qt::AlignmentFlag>.i;
        }
        uVar43 = uVar9;
        if ((((LVar34 != LeftToRight) && ((uVar9 & 0x10) == 0)) && (uVar43 = 2, (uVar9 & 1) == 0))
           && (uVar43 = 1, (uVar9 & 2) == 0)) {
          uVar43 = uVar9;
        }
        uVar38 = 0;
        uVar9 = 0;
        if (opt[1].super_QStyleOption.version != 2) {
          iVar10 = (**(code **)(*(long *)this + 0xd8))(this,0,opt,1,w);
          uVar38 = (extraout_EDX - iVar10) + 1;
          iVar10 = (**(code **)(*(long *)this + 0xd8))(this,0,opt,2,w);
          uVar9 = (extraout_EDX_00 - iVar10) + 1;
        }
        uVar14 = -(uVar20 & 1) & uVar38;
        uVar29 = -(uVar43 & 1) & uVar9;
        if ((int)uVar29 < (int)uVar14) {
          uVar29 = uVar14;
        }
        uVar38 = (int)(uVar20 << 0x1e) >> 0x1f & uVar38;
        uVar9 = (int)(uVar43 << 0x1e) >> 0x1f & uVar9;
        if ((int)uVar9 < (int)uVar38) {
          uVar9 = uVar38;
        }
        uVar22 = QVar49._8_8_ & 0xffffffff00000000 | (ulong)(QVar49.x2.m_i.m_i - uVar9);
        QVar51.x2.m_i = (int)uVar22;
        QVar51.y2.m_i = (int)(uVar22 >> 0x20);
        QVar51.x1.m_i = (int)QVar49._0_8_;
        QVar51.y1.m_i = (int)((ulong)QVar49._0_8_ >> 0x20);
        uVar22 = (ulong)(uVar29 + QVar49.x1.m_i.m_i);
        goto LAB_00367e14;
      }
      uVar22 = QVar51._0_8_;
LAB_00367e14:
      uVar19 = QVar51._0_8_;
      QVar52.x2.m_i = (int)QVar51._8_8_;
      QVar52.y2.m_i = (int)((ulong)QVar51._8_8_ >> 0x20);
      QVar52.x1.m_i = (int)uVar22;
      QVar52.y1.m_i = (int)(uVar22 >> 0x20);
    }
    else {
      local_228 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_238 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_230 = &DAT_aaaaaaaaaaaaaaaa;
      local_248 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_240 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_258 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_250 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_268._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_268._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xfffffffffffffd90 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionSpinBox::QStyleOptionSpinBox
                ((QStyleOptionSpinBox *)local_278,(QStyleOptionSpinBox *)opt);
      local_268 = (undefined1  [16])
                  QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
      bVar8 = QRenderRule::baseStyleCanDraw(&local_160);
      if (bVar8) {
        pQVar15 = baseStyle(this);
        QVar52 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))(pQVar15,0,local_278,sc,w);
      }
      else {
        QVar52 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_SpinBox,(QStyleOptionComplex *)local_278,sc,w);
      }
      uVar19 = QVar52._0_8_;
      QStyleOption::~QStyleOption((QStyleOption *)local_278);
    }
    QVar49.x2.m_i = (int)QVar52._8_8_;
    QVar49.y2.m_i = (int)((ulong)QVar52._8_8_ >> 0x20);
    QVar49.x1.m_i = (int)uVar19;
    QVar49.y1.m_i = (int)((ulong)uVar19 >> 0x20);
    uVar22 = QVar52._0_8_;
    QRenderRule::~QRenderRule((QRenderRule *)local_1e8);
    QRenderRule::~QRenderRule((QRenderRule *)local_d8);
    goto LAB_00367669;
  case CC_ComboBox:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       ((opt->super_QStyleOption).type != 0xf0004)) break;
    if ((local_160.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       ((local_160.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_160.bd.d.ptr + 0x68))->d)
          .ptr == (QStyleSheetBorderImageData *)0x0 &&
         (*(BorderStyle *)((long)local_160.bd.d.ptr + 0x38) == BorderStyle_Native)))))) {
      memset((QStyleOptionComboBox *)local_d8,0xaa,0x90);
      QStyleOptionComboBox::QStyleOptionComboBox
                ((QStyleOptionComboBox *)local_d8,(QStyleOptionComboBox *)opt);
      local_d8._16_16_ =
           (undefined1  [16])QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
      bVar8 = QRenderRule::baseStyleCanDraw(&local_160);
      if (bVar8) {
        pQVar15 = baseStyle(this);
        QVar49 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))(pQVar15,1,local_d8,sc,w);
      }
      else {
        QVar49 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_ComboBox,(QStyleOptionComplex *)local_d8,sc,w);
      }
      QStyleOptionComboBox::~QStyleOptionComboBox((QStyleOptionComboBox *)local_d8);
      goto LAB_0036851c;
    }
    if (sc == SC_ComboBoxArrow) {
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,8);
      LVar34 = (opt->super_QStyleOption).direction;
      iVar10 = 8;
LAB_00367c9e:
      QVar49 = positionRect(this,w,&local_160,(QRenderRule *)local_d8,iVar10,
                            &(opt->super_QStyleOption).rect,LVar34);
      goto LAB_003682ee;
    }
    if (sc == SC_ComboBoxEditField) {
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,8);
      pQVar1 = &(opt->super_QStyleOption).rect;
      QVar49 = QRenderRule::contentsRect(&local_160,pQVar1);
      uVar25 = QVar49._8_8_;
      uVar22 = QVar49._0_8_;
      _local_1e8 = QVar49;
      QVar51 = positionRect(this,w,&local_160,(QRenderRule *)local_d8,8,pQVar1,
                            (opt->super_QStyleOption).direction);
      if ((local_78.d.ptr == (QStyleSheetPositionData *)0x0) ||
         (((((Alignment *)((long)local_78.d.ptr + 0x18))->
           super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).super_QFlagsStorage<Qt::AlignmentFlag>.i
          & 1) == 0)) {
        LVar34 = (opt->super_QStyleOption).direction;
        uVar25 = (ulong)(uint)(~QVar51.x2.m_i.m_i + QVar51.x1.m_i.m_i + QVar49.x2.m_i.m_i) |
                 uVar25 & 0xffffffff00000000;
        local_278._8_4_ = (int)uVar25;
        RStack_26c.m_i = (int)(uVar25 >> 0x20);
        local_278._0_4_ = (int)uVar22;
        local_278._4_4_ = (int)(uVar22 >> 0x20);
      }
      else {
        LVar34 = (opt->super_QStyleOption).direction;
        uVar22 = (ulong)((QVar51.x2.m_i.m_i - QVar51.x1.m_i) + QVar49.x1.m_i.m_i + 1) |
                 uVar22 & 0xffffffff00000000;
        local_278._8_4_ = (int)uVar25;
        RStack_26c.m_i = (int)(uVar25 >> 0x20);
        local_278._0_4_ = (int)uVar22;
        local_278._4_4_ = (int)(uVar22 >> 0x20);
      }
      QVar49 = QStyle::visualRect(LVar34,(QRect *)local_1e8,(QRect *)local_278);
      goto LAB_003682ee;
    }
    if (sc == SC_ComboBoxFrame) goto LAB_00367609;
    pQVar15 = baseStyle(this);
    lVar30 = *(long *)pQVar15;
    cc = CC_ComboBox;
    goto LAB_00367656;
  case CC_ScrollBar:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       ((opt->super_QStyleOption).type != 0xf0001)) break;
    puVar33 = &DAT_00670d90;
    pQVar36 = (QStyleOptionComplex *)local_1e8;
    for (lVar30 = 0x10; lVar30 != 0; lVar30 = lVar30 + -1) {
      uVar19 = *puVar33;
      (pQVar36->super_QStyleOption).version = (int)uVar19;
      (pQVar36->super_QStyleOption).type = (int)((ulong)uVar19 >> 0x20);
      puVar33 = puVar33 + (ulong)bVar45 * -2 + 1;
      pQVar36 = (QStyleOptionComplex *)((long)pQVar36 + (ulong)bVar45 * -0x10 + 8);
    }
    QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)local_1e8,1,0xf0001);
    local_170 = (ulong)(uint)local_170;
    QStyleOption::operator=((QStyleOption *)local_1e8,&opt->super_QStyleOption);
    local_1a8.d.ptr = *(totally_ordered_wrapper<QStyleSheetBackgroundData_*> *)&opt->subControls;
    local_170._0_4_ = opt[1].super_QStyleOption.palette.currentGroup;
    local_170._4_4_ = *(undefined4 *)&opt[1].super_QStyleOption.palette.field_0xc;
    local_1a0.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetBorderData_*> *)&opt[1].super_QStyleOption;
    QStack_198.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetOutlineData_*> *)&opt[1].super_QStyleOption.state;
    local_190.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetGeometryData_*> *)&opt[1].super_QStyleOption.rect;
    QStack_188.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetPositionData_*> *)&opt[1].super_QStyleOption.rect.x2;
    local_180.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetImageData_*> *)&opt[1].super_QStyleOption.fontMetrics;
    QStack_178.d.ptr =
         (totally_ordered_wrapper<QStyleSheetImageData_*>)opt[1].super_QStyleOption.palette.d;
    pQVar1 = &(opt->super_QStyleOption).rect;
    local_1d8 = QRenderRule::borderRect(&local_160,pQVar1);
    bVar8 = QRenderRule::hasDrawable(&local_160);
    if (local_160.b.d.ptr == (QStyleSheetBoxData *)0x0 && !bVar8) {
LAB_003684ab:
      bVar8 = QRenderRule::baseStyleCanDraw(&local_160);
      if (bVar8) {
        pQVar15 = baseStyle(this);
        QVar49 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))(pQVar15,2,local_1e8,sc,w);
      }
      else {
        QVar49 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_ScrollBar,(QStyleOptionComplex *)local_1e8,sc,w)
        ;
      }
    }
    else {
      if (local_160.b.d.ptr == (QStyleSheetBoxData *)0x0) {
        bVar8 = QRenderRule::baseStyleCanDraw(&local_160);
        if (bVar8) {
          pQVar15 = baseStyle(this);
          QVar49 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))(pQVar15,2,opt,0x80,w);
        }
        else {
          QVar49 = QCommonStyle::subControlRect
                             ((QCommonStyle *)this,CC_ScrollBar,opt,SC_ScrollBarGroove,w);
        }
      }
      else {
        QVar49 = QRenderRule::contentsRect(&local_160,pQVar1);
      }
      iVar10 = 0;
      _local_278 = QVar49;
      if (0xf < (int)sc) {
        if ((int)sc < 0x40) {
          if (sc == SC_ScrollBarFirst) {
            iVar10 = 0x1a;
          }
          else {
            iVar10 = 0;
            if (sc == SC_ScrollBarLast) {
              iVar10 = 0x1b;
            }
          }
        }
        else {
          if (sc == SC_ScrollBarGroove) goto LAB_0036850f;
          if (sc == SC_ScrollBarSlider) goto switchD_003680a8_caseD_4;
        }
        goto switchD_003680a8_caseD_3;
      }
      iVar10 = 0;
      switch(sc) {
      case SC_ComboBoxFrame:
        iVar10 = 0x18;
        break;
      case SC_ComboBoxEditField:
        iVar10 = 0x19;
        break;
      case SC_ComboBoxArrow:
      case SC_ComboBoxListBoxPopup:
switchD_003680a8_caseD_4:
        bVar8 = hasStyleRule(this,&w->super_QObject,0x15);
        if (bVar8) {
          memset((QRenderRule *)local_d8,0xaa,0x88);
          renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x15);
          if (local_78.d.ptr == (QStyleSheetPositionData *)0x0) {
            OVar24 = Origin_Content;
          }
          else {
            OVar24 = *(Origin *)((long)local_78.d.ptr + 0x14);
          }
          QVar49 = QRenderRule::originRect(&local_160,pQVar1,OVar24);
          QRenderRule::~QRenderRule((QRenderRule *)local_d8);
        }
        RVar41 = QVar49.x1.m_i;
        RVar28 = QVar49.y1.m_i;
        RVar13.m_i = RVar28.m_i;
        if ((int)local_1a0.d.ptr == 1) {
          RVar13.m_i = RVar41.m_i;
        }
        RVar40 = QVar49.x2.m_i;
        RVar26 = QVar49.y2.m_i;
        RVar32.m_i = RVar26.m_i;
        if ((int)local_1a0.d.ptr == 1) {
          RVar32.m_i = RVar40.m_i;
        }
        iVar12 = (RVar32.m_i - RVar13.m_i) + 1;
        IVar31 = opt[1].super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                 super_QFlagsStorage<QStyle::StateFlag>.i;
        uVar9 = IVar31 - opt[1].super_QStyleOption.type;
        min = IVar31;
        iVar10 = iVar12;
        if (uVar9 != 0) {
          iVar10 = *(int *)&opt[1].super_QStyleOption.field_0x24;
          iVar39 = (**(code **)(*(long *)this + 0xe0))(this,10,opt,w);
          iVar10 = (int)(((long)iVar10 * (long)iVar12) / (long)(ulong)(iVar10 + uVar9));
          if (iVar10 < iVar39) {
            iVar10 = iVar39;
          }
          if (0x3fffffff < uVar9) {
            iVar10 = iVar39;
          }
          if (iVar12 <= iVar10) {
            iVar10 = iVar12;
          }
          min = opt[1].super_QStyleOption.type;
          IVar31 = opt[1].super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i;
        }
        RVar13.m_i = RVar28.m_i;
        if ((int)local_1a0.d.ptr == 1) {
          RVar13.m_i = RVar41.m_i;
        }
        iVar12 = QStyle::sliderPositionFromValue
                           (min,IVar31,opt[1].super_QStyleOption.rect.x2.m_i,iVar12 - iVar10,
                            SUB41(opt[1].super_QStyleOption.rect.y1.m_i,0));
        RVar13.m_i = iVar12 + RVar13.m_i;
        if (opt[1].super_QStyleOption.version == 1) {
          RVar32.m_i = iVar10 + RVar13.m_i + -1;
          local_d8._4_4_ = RVar28.m_i;
          RVar21.m_i = RVar13.m_i;
          local_d8._0_4_ = RVar13.m_i;
          local_d8._8_4_ = RVar32.m_i;
          local_d8._12_4_ = RVar26.m_i;
          RVar13.m_i = RVar26.m_i;
          RVar35.m_i = RVar28.m_i;
        }
        else {
          local_d8._12_4_ = iVar10 + RVar13.m_i + -1;
          local_d8._4_4_ = RVar13.m_i;
          RVar32.m_i = RVar41.m_i;
          RVar21.m_i = RVar40.m_i;
          local_d8._0_4_ = RVar41.m_i;
          local_d8._8_4_ = RVar40.m_i;
          RVar35.m_i = local_d8._12_4_;
        }
        if ((sc == SC_ComboBoxListBoxPopup) ||
           (RVar21.m_i = RVar40.m_i, RVar28.m_i = RVar35.m_i, RVar13.m_i = RVar26.m_i,
           RVar41.m_i = RVar32.m_i, sc == SC_ComboBoxArrow)) {
          local_d8._0_8_ = CONCAT44(RVar28.m_i,RVar41.m_i);
          local_d8._12_4_ = RVar13.m_i;
          local_d8._8_4_ = RVar21.m_i;
        }
        QVar49 = QStyle::visualRect(RStack_1dc.m_i,(QRect *)local_278,(QRect *)local_d8);
        goto LAB_0036850f;
      }
switchD_003680a8_caseD_3:
      bVar8 = hasStyleRule(this,&w->super_QObject,iVar10);
      if (!bVar8) goto LAB_003684ab;
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,iVar10);
      if (((local_78.d.ptr == (QStyleSheetPositionData *)0x0) && (local_80 == (QSize)0x0)) &&
         (local_a0.d.ptr == (QStyleSheetBoxData *)0x0)) {
        QRenderRule::~QRenderRule((QRenderRule *)local_d8);
        goto LAB_003684ab;
      }
      local_298 = _local_278;
      if (local_160.b.d.ptr != (QStyleSheetBoxData *)0x0) {
        if ((local_78.d.ptr == (QStyleSheetPositionData *)0x0) ||
           (OVar24 = *(Origin *)((long)local_78.d.ptr + 0x14), OVar24 == Origin_Unknown)) {
          OVar24 = Origin_Margin;
          if (iVar10 - 8U < 0x14) {
            OVar24 = *(Origin *)(&DAT_006710f0 + (ulong)(iVar10 - 8U) * 4);
          }
        }
        local_298 = QRenderRule::originRect(&local_160,pQVar1,OVar24);
      }
      QVar49 = positionRect(this,w,(QRenderRule *)local_d8,iVar10,&local_298,RStack_1dc.m_i);
      QRenderRule::~QRenderRule((QRenderRule *)local_d8);
    }
LAB_0036850f:
    QStyleOption::~QStyleOption((QStyleOption *)local_1e8);
    goto LAB_0036851c;
  case CC_Slider:
    if (((opt != (QStyleOptionComplex *)0x0) && (0 < (opt->super_QStyleOption).version)) &&
       ((opt->super_QStyleOption).type == 0xf0001)) {
      memset(local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x31);
      bVar8 = QRenderRule::hasDrawable((QRenderRule *)local_d8);
      if (bVar8) {
        QSharedDataPointer<QStyleSheetImageData>::reset(local_70,(QStyleSheetImageData *)0x0);
        QVar49 = positionRect(this,w,&local_160,(QRenderRule *)local_d8,0x31,
                              &(opt->super_QStyleOption).rect,(opt->super_QStyleOption).direction);
        _local_278 = QVar49;
        if (sc == SC_ComboBoxFrame) goto LAB_003682ee;
        if (sc == SC_ComboBoxEditField) {
          uVar9 = opt[1].super_QStyleOption.version;
          local_298 = QRenderRule::contentsRect((QRenderRule *)local_d8,(QRect *)local_278);
          memset((QRenderRule *)local_1e8,0xaa,0x88);
          renderRule((QRenderRule *)local_1e8,this,&w->super_QObject,&opt->super_QStyleOption,0x32);
          QVar17 = QRenderRule::size((QRenderRule *)local_1e8);
          QVar16 = (QSize)((ulong)QVar17 >> 0x20);
          if ((uVar9 & 1) != 0) {
            QVar16 = QVar17;
          }
          RVar37 = QVar16.wd.m_i;
          QSharedDataPointer<QStyleSheetImageData>::reset(&local_180,(QStyleSheetImageData *)0x0);
          QVar7.d.ptr = local_190.d.ptr;
          if (local_190.d.ptr != (QStyleSheetGeometryData *)0x0) {
            local_190.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
            LOCK();
            *(int *)QVar7.d.ptr = *(int *)QVar7.d.ptr + -1;
            UNLOCK();
            if (*(int *)QVar7.d.ptr == 0) {
              operator_delete((void *)QVar7.d.ptr,0x1c);
            }
          }
          local_298 = positionRect(this,w,(QRenderRule *)local_1e8,0x32,&local_298,
                                   (opt->super_QStyleOption).direction);
          iVar10 = opt[1].super_QStyleOption.type;
          IVar31 = opt[1].super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i;
          bVar8 = SUB41(opt[1].super_QStyleOption.rect.y1.m_i,0);
          iVar12 = opt[1].super_QStyleOption.rect.x2.m_i;
          RVar41 = local_298.y1.m_i;
          RVar13 = local_298.y2.m_i;
          RVar28 = local_298.x2.m_i;
          RVar32 = local_298.x1.m_i;
          if ((uVar9 & 1) == 0) {
            iVar10 = QStyle::sliderPositionFromValue
                               (iVar10,IVar31,iVar12,(RVar13.m_i - (RVar41.m_i + RVar37.m_i)) + 1,
                                bVar8);
            local_298.x2.m_i = (RVar28.m_i - RVar32.m_i) + local_298.x1.m_i;
            local_298.y2.m_i = RVar37.m_i + iVar10 + local_298.y1.m_i + -1;
            local_298.y1.m_i = iVar10 + local_298.y1.m_i;
            RVar28.m_i = local_298.x1.m_i;
          }
          else {
            iVar10 = QStyle::sliderPositionFromValue
                               (iVar10,IVar31,iVar12,(RVar28.m_i - (RVar32.m_i + RVar37.m_i)) + 1,
                                bVar8);
            RVar28.m_i = iVar10 + local_298.x1.m_i;
            local_298.x2.m_i = RVar37.m_i + RVar28.m_i + -1;
            local_298.y2.m_i = (RVar13.m_i - RVar41.m_i) + local_298.y1.m_i;
          }
          local_298.x1.m_i = RVar28.m_i;
          QVar49 = local_298;
          if (local_1b0.d.ptr != (QStyleSheetBoxData *)0x0) {
            QVar49.y1.m_i = local_298.y1.m_i + *(int *)((long)local_1b0.d.ptr + 4);
            QVar49.x1.m_i = RVar28.m_i + *(int *)((long)local_1b0.d.ptr + 0x10);
            QVar49.y2.m_i = local_298.y2.m_i - *(int *)((long)local_1b0.d.ptr + 0xc);
            QVar49.x2.m_i = local_298.x2.m_i - *(int *)((long)local_1b0.d.ptr + 8);
          }
          goto LAB_003682d9;
        }
        QRenderRule::~QRenderRule((QRenderRule *)local_d8);
      }
      else {
LAB_0036762c:
        QRenderRule::~QRenderRule((QRenderRule *)local_d8);
      }
    }
    break;
  case CC_ToolButton:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       ((opt->super_QStyleOption).type != 0xf0003)) break;
    if ((local_160.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((local_160.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_160.bd.d.ptr + 0x68))->d)
          .ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)local_160.bd.d.ptr + 0x38) != BorderStyle_Native)))))) {
      if (sc == SC_ComboBoxEditField) {
        memset((QRenderRule *)local_d8,0xaa,0x88);
        renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x11);
        LVar34 = (opt->super_QStyleOption).direction;
        iVar10 = 0x11;
        goto LAB_00367c9e;
      }
      if (sc == SC_ComboBoxFrame) {
LAB_00367609:
        QVar49 = QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
        goto LAB_00367660;
      }
    }
    memset((QStyleOptionToolButton *)local_d8,0xaa,0x98);
    QStyleOptionToolButton::QStyleOptionToolButton
              ((QStyleOptionToolButton *)local_d8,(QStyleOptionToolButton *)opt);
    local_d8._16_16_ =
         (undefined1  [16])QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
    bVar8 = QRenderRule::baseStyleCanDraw(&local_160);
    if (bVar8) {
      pQVar15 = baseStyle(this);
      QVar49 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))(pQVar15,4,local_d8,sc,w);
    }
    else {
      QVar49 = QCommonStyle::subControlRect
                         ((QCommonStyle *)this,CC_ToolButton,(QStyleOptionComplex *)local_d8,sc,w);
    }
    QStyleOptionToolButton::~QStyleOptionToolButton((QStyleOptionToolButton *)local_d8);
LAB_0036851c:
    uVar22 = QVar49._0_8_;
    goto LAB_00367669;
  case CC_TitleBar:
    if (((opt != (QStyleOptionComplex *)0x0) && (0 < (opt->super_QStyleOption).version)) &&
       ((opt->super_QStyleOption).type == 0xf0005)) {
      memset(local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x41);
      bVar8 = QRenderRule::hasDrawable((QRenderRule *)local_d8);
      if (((!bVar8) && (local_a0.d.ptr == (QStyleSheetBoxData *)0x0)) &&
         (local_90.d.ptr == (QStyleSheetBorderData *)0x0)) goto LAB_0036762c;
      local_1e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      titleBarLayout((QStyleSheetStyle *)local_1e8,(QWidget *)this,(QStyleOptionTitleBar *)w);
      QVar49 = QHash<QStyle::SubControl,_QRect>::value
                         ((QHash<QStyle::SubControl,_QRect> *)local_1e8,&local_27c);
      QHash<QStyle::SubControl,_QRect>::~QHash((QHash<QStyle::SubControl,_QRect> *)local_1e8);
LAB_003682ee:
      QRenderRule::~QRenderRule((QRenderRule *)local_d8);
      goto LAB_0036851c;
    }
    break;
  case CC_GroupBox:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       ((opt->super_QStyleOption).type != 0xf0006)) break;
    if ((sc != SC_ComboBoxListBoxPopup) && (sc != SC_ComboBoxArrow)) {
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x10);
      memset((QRenderRule *)local_1e8,0xaa,0x88);
      pQVar18 = renderRule((QRenderRule *)local_1e8,this,&w->super_QObject,&opt->super_QStyleOption,
                           0xf);
      auVar46._8_4_ = (int)local_190.d.ptr;
      auVar46._0_8_ = QStack_188.d.ptr;
      auVar46._12_4_ = local_190.d.ptr._4_4_;
      auVar48._8_8_ = local_1a0.d.ptr;
      auVar48._0_8_ = local_1b0.d.ptr;
      auVar48 = auVar48 | auVar46;
      auVar47._0_4_ = -(uint)(auVar48._0_4_ == 0);
      auVar47._4_4_ = -(uint)(auVar48._4_4_ == 0);
      auVar47._8_4_ = -(uint)(auVar48._8_4_ == 0);
      auVar47._12_4_ = -(uint)(auVar48._12_4_ == 0);
      iVar10 = movmskps((int)pQVar18,auVar47);
      if (((iVar10 == 0xf) &&
          ((local_80 == (QSize)0x0 ||
           ((*(int *)((long)local_80 + 0xc) == -1 && (*(int *)((long)local_80 + 0x10) == -1)))))) &&
         ((local_70[0].d.ptr == (QStyleSheetImageData *)0x0 ||
          (((((QSize *)((long)local_70[0].d.ptr + 0x14))->wd).m_i < 0 ||
           (((Representation *)((long)local_70[0].d.ptr + 0x18))->m_i < 0)))))) {
        memset((QStyleOptionGroupBox *)local_278,0xaa,0x88);
        QStyleOptionGroupBox::QStyleOptionGroupBox
                  ((QStyleOptionGroupBox *)local_278,(QStyleOptionGroupBox *)opt);
        local_268 = (undefined1  [16])
                    QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
        pQVar15 = baseStyle(this);
        QVar49 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))
                                  (pQVar15,7,(QStyleOptionGroupBox *)local_278,sc,w);
        QStyleOptionGroupBox::~QStyleOptionGroupBox((QStyleOptionGroupBox *)local_278);
      }
      else {
        iVar10 = QFontMetrics::horizontalAdvance
                           ((QString *)&(opt->super_QStyleOption).fontMetrics,(int)opt + 0x50);
        uVar9 = QFontMetrics::height();
        iVar12 = (**(code **)(*(long *)this + 0xe0))(this,0x43,opt,w);
        iVar39 = (**(code **)(*(long *)this + 0xe0))(this,0x25,opt,w);
        uVar22 = (**(code **)(*(long *)this + 0xe0))(this,0x26,opt,w);
        uVar20 = (opt->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                 super_QFlagsStorage<QStyle::SubControl>.i & 1;
        iVar11 = (int)uVar22;
        uVar25 = uVar22 & 0xffffffff;
        if (iVar11 < (int)uVar9) {
          uVar25 = (ulong)uVar9;
        }
        if (uVar20 == 0) {
          uVar25 = (ulong)uVar9;
        }
        iVar10 = (-uVar20 & iVar12 + iVar39) + iVar10;
        iVar42 = (int)uVar25;
        if (local_190.d.ptr == (QStyleSheetGeometryData *)0x0) {
          ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
          (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i = 0;
          ptr->minWidth = iVar10;
          ptr->minHeight = iVar42;
          ptr->width = iVar10;
          ptr->height = iVar42;
          ptr->maxWidth = -1;
          ptr->maxHeight = -1;
          QSharedDataPointer<QStyleSheetGeometryData>::reset(&local_190,ptr);
        }
        else {
          if (*(int *)local_190.d.ptr != 1) {
            QSharedDataPointer<QStyleSheetGeometryData>::detach_helper(&local_190);
          }
          *(int *)((long)local_190.d.ptr + 0xc) = iVar10;
          if (*(int *)local_190.d.ptr != 1) {
            QSharedDataPointer<QStyleSheetGeometryData>::detach_helper(&local_190);
          }
          *(int *)((long)local_190.d.ptr + 0x10) = iVar42;
        }
        if (QStack_188.d.ptr == (QStyleSheetPositionData *)0x0) {
          ptr_00 = (QStyleSheetPositionData *)operator_new(0x24);
          IVar3 = *(Int *)&opt[1].super_QStyleOption.fontMetrics;
          ptr_00->super_QSharedData = (QAtomicInt)0x0;
          ptr_00->left = 0;
          ptr_00->top = 0;
          ptr_00->bottom = 0;
          ptr_00->right = 0;
          ptr_00->origin = Origin_Border;
          (ptr_00->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
          super_QFlagsStorage<Qt::AlignmentFlag>.i = IVar3;
          ptr_00->mode = PositionMode_Static;
          ptr_00->textAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x0;
          QSharedDataPointer<QStyleSheetPositionData>::reset(&QStack_188,ptr_00);
        }
        _local_278 = positionRect(this,w,&local_160,(QRenderRule *)local_1e8,0xf,
                                  &(opt->super_QStyleOption).rect,
                                  (opt->super_QStyleOption).direction);
        IVar5 = (opt->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                super_QFlagsStorage<QStyle::SubControl>.i;
        QVar49 = QRenderRule::contentsRect((QRenderRule *)local_1e8,(QRect *)local_278);
        lVar30 = QVar49._0_8_;
        if ((IVar5 & 1) != 0) {
          local_278._0_4_ = (int)lVar30;
          local_278._4_4_ = (int)((ulong)lVar30 >> 0x20);
          lVar23 = (long)QVar49._8_8_ >> 0x20;
          if (sc == SC_ComboBoxEditField) {
            local_278._0_4_ = iVar12 + iVar39 + QVar49.x1.m_i.m_i;
            lVar23 = lVar23 + (lVar30 >> 0x20);
            RVar13.m_i = (int)((ulong)(lVar23 - (lVar23 >> 0x3f)) >> 1) -
                         ((int)(uVar25 >> 0x1f) + iVar42 >> 1);
            pQVar27 = QVar49._8_8_;
          }
          else {
            lVar23 = lVar23 + (lVar30 >> 0x20);
            RVar13.m_i = (int)((ulong)(lVar23 - (lVar23 >> 0x3f)) >> 1) -
                         ((int)(((uint)(uVar22 >> 0x1f) & 1) + iVar11) >> 1);
            local_278._8_4_ = iVar39 + QVar49.x1.m_i.m_i + -1;
            local_278._0_4_ = (int)lVar30;
            local_278._4_4_ = (int)((ulong)lVar30 >> 0x20);
            RStack_26c.m_i = iVar11 + RVar13.m_i + -1;
            pQVar27 = stack0xfffffffffffffd90;
          }
          local_278._4_4_ = RVar13.m_i;
          QVar49._8_8_ = pQVar27;
          QVar49.x1.m_i = local_278._0_4_;
          QVar49.y1.m_i = RVar13.m_i;
        }
      }
LAB_003682d9:
      QRenderRule::~QRenderRule((QRenderRule *)local_1e8);
      goto LAB_003682ee;
    }
    if ((local_160.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       ((local_160.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_160.bd.d.ptr + 0x68))->d)
          .ptr == (QStyleSheetBorderImageData *)0x0 &&
         (*(BorderStyle *)((long)local_160.bd.d.ptr + 0x38) == BorderStyle_Native)))))) {
      memset((QStyleOptionGroupBox *)local_d8,0xaa,0x88);
      QStyleOptionGroupBox::QStyleOptionGroupBox
                ((QStyleOptionGroupBox *)local_d8,(QStyleOptionGroupBox *)opt);
      local_d8._16_16_ =
           (undefined1  [16])QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
      pQVar15 = baseStyle(this);
      QVar49 = (QRect)(**(code **)(*(long *)pQVar15 + 0xd8))
                                (pQVar15,7,(QStyleOptionGroupBox *)local_d8,sc,w);
      QStyleOptionGroupBox::~QStyleOptionGroupBox((QStyleOptionGroupBox *)local_d8);
      goto LAB_0036851c;
    }
    if (sc == SC_ComboBoxListBoxPopup) goto LAB_00367609;
    QVar49 = QRenderRule::contentsRect(&local_160,&(opt->super_QStyleOption).rect);
    goto LAB_00367660;
  case CC_MdiControls:
    bVar8 = hasStyleRule(this,&w->super_QObject,0x3e);
    if (!bVar8) {
      bVar8 = hasStyleRule(this,&w->super_QObject,0x40);
      if (!bVar8) {
        bVar8 = hasStyleRule(this,&w->super_QObject,0x3f);
        if (!bVar8) break;
      }
    }
    local_268._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffd90 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffe20 = (QVariant *)"button-layout";
    local_1e8._0_4_ = 0xd;
    local_1e8._4_4_ = 0;
    QHash<QString,_QVariant>::value<QLatin1String,_true>
              ((QVariant *)local_d8,&local_160.styleHints,(QLatin1String *)local_1e8);
    ::QVariant::toList();
    ::QVariant::~QVariant((QVariant *)local_d8);
    if (local_268._0_8_ == 0) {
      layout.m_data = "mNX";
      layout.m_size = 3;
      subControlLayout((QList<QVariant> *)local_1e8,layout);
      QVar49 = _local_1e8;
      uVar19 = local_1d8._0_8_;
      auVar4._8_8_ = 0;
      auVar4._0_4_ = local_1d8.x2.m_i;
      auVar4._4_4_ = local_1d8.y2.m_i;
      local_1d8 = (QRect)(auVar4 << 0x40);
      QVar51 = local_1d8;
      _local_1e8 = (QRect)ZEXT816(0);
      local_d8._0_8_ = local_278._0_8_;
      local_d8._8_8_ = stack0xfffffffffffffd90;
      _local_278 = QVar49;
      local_d8._16_8_ = local_268._0_8_;
      local_1d8.x1.m_i = (int)uVar19;
      local_1d8.y1.m_i = SUB84(uVar19,4);
      local_268._0_4_ = local_1d8.x1.m_i;
      local_268._4_4_ = local_1d8.y1.m_i;
      local_1d8 = QVar51;
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_d8);
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_1e8);
    }
    memset((QRenderRule *)local_d8,0xaa,0x88);
    QRenderRule::QRenderRule((QRenderRule *)local_d8);
    if (local_268._0_8_ == 0) {
      iVar10 = 0;
      RVar37.m_i = 0;
    }
    else {
      lVar30 = local_268._0_8_ << 5;
      QVar16.wd.m_i = 0;
      QVar16.ht.m_i = 0;
      iVar10 = 0;
      pQVar27 = stack0xfffffffffffffd90;
      do {
        uVar9 = ::QVariant::toInt((bool *)pQVar27);
        if ((0xfffffffc < uVar9 - 0x41) &&
           (SVar2 = knownPseudoElements[uVar9].subControl,
           ((opt->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
            super_QFlagsStorage<QStyle::SubControl>.i & SVar2) != SC_None)) {
          renderRule((QRenderRule *)local_1e8,this,&w->super_QObject,&opt->super_QStyleOption,uVar9)
          ;
          QRenderRule::operator=((QRenderRule *)local_d8,(QRenderRule *)local_1e8);
          QRenderRule::~QRenderRule((QRenderRule *)local_1e8);
          if (local_80 == (QSize)0x0) {
            uVar22 = 0xffffffff;
            if ((local_70[0].d.ptr == (QStyleSheetImageData *)0x0) ||
               ((((QSize *)((long)local_70[0].d.ptr + 0x14))->wd).m_i < 0)) {
              QVar17.wd.m_i = -1;
              QVar17.ht.m_i = 0;
            }
            else {
              QVar17.wd.m_i = -1;
              QVar17.ht.m_i = 0;
              if (-1 < ((Representation *)((long)local_70[0].d.ptr + 0x18))->m_i) {
                QVar17 = *(QSize *)((long)local_70[0].d.ptr + 0x14);
                uVar22 = (ulong)QVar17 >> 0x20;
              }
            }
          }
          else {
            QVar17.ht.m_i = 0;
            QVar17.wd.m_i = *(int *)((long)local_80 + 0xc);
            uVar22 = (ulong)(uint)*(int *)((long)local_80 + 0x10);
          }
          uVar22 = (ulong)QVar17 & 0xffffffff | uVar22 << 0x20;
          local_1e8._0_4_ = (int)uVar22;
          local_1e8._4_4_ = (int)(uVar22 >> 0x20);
          QVar16 = QRenderRule::boxSize((QRenderRule *)local_d8,(QSize *)local_1e8,7);
          RVar37 = QVar16.wd.m_i;
          if (SVar2 == sc) break;
          iVar10 = iVar10 + RVar37.m_i;
        }
        RVar37 = QVar16.wd.m_i;
        pQVar27 = pQVar27 + 1;
        lVar30 = lVar30 + -0x20;
      } while (lVar30 != 0);
    }
    iVar12 = (opt->super_QStyleOption).rect.y1.m_i;
    iVar39 = (opt->super_QStyleOption).rect.y2.m_i;
    iVar11 = iVar10 + RVar37.m_i + -1;
    if (local_a0.d.ptr == (QStyleSheetBoxData *)0x0) {
      uVar22 = CONCAT44(iVar12,iVar10);
    }
    else {
      iVar11 = iVar11 - *(int *)((long)local_a0.d.ptr + 8);
      iVar39 = iVar39 - *(int *)((long)local_a0.d.ptr + 0xc);
      uVar22 = CONCAT44(iVar12 + *(int *)((long)local_a0.d.ptr + 4),
                        iVar10 + *(int *)((long)local_a0.d.ptr + 0x10));
    }
    QVar49.y2.m_i = iVar39;
    QVar49.x2.m_i = iVar11;
    QRenderRule::~QRenderRule((QRenderRule *)local_d8);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_278);
    QVar49.x1.m_i = (int)uVar22;
    QVar49.y1.m_i = (int)(uVar22 >> 0x20);
    goto LAB_00367669;
  }
  pQVar15 = baseStyle(this);
  lVar30 = *(long *)pQVar15;
LAB_00367656:
  QVar49 = (QRect)(**(code **)(lVar30 + 0xd8))(pQVar15,cc,opt,sc,w);
LAB_00367660:
  uVar22 = QVar49._0_8_;
LAB_00367669:
  QRenderRule::~QRenderRule(&local_160);
  if (pQVar6 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_00367686:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar50._0_8_ = uVar22 & 0xffffffff | QVar49._0_8_ & 0xffffffff00000000;
    QVar50.x2.m_i = (int)QVar49._8_8_;
    QVar50.y2.m_i = (int)((ulong)QVar49._8_8_ >> 0x20);
    return QVar50;
  }
  __stack_chk_fail();
}

Assistant:

QRect QStyleSheetStyle::subControlRect(ComplexControl cc, const QStyleOptionComplex *opt, SubControl sc,
                              const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->subControlRect(cc, opt, sc, w))

    QRenderRule rule = renderRule(w, opt);
    switch (cc) {
    case CC_ComboBox:
        if (const QStyleOptionComboBox *cb = qstyleoption_cast<const QStyleOptionComboBox *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                switch (sc) {
                case SC_ComboBoxFrame: return rule.borderRect(opt->rect);
                case SC_ComboBoxEditField:
                    {
                        QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                        QRect r = rule.contentsRect(opt->rect);
                        QRect r2 = positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown,
                                opt->rect, opt->direction);
                        if (subRule.hasPosition() && subRule.position()->position & Qt::AlignLeft) {
                            return visualRect(opt->direction, r, r.adjusted(r2.width(),0,0,0));
                        } else {
                            return visualRect(opt->direction, r, r.adjusted(0,0,-r2.width(),0));
                        }
                    }
                case SC_ComboBoxArrow: {
                    QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                    return positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown, opt->rect, opt->direction);
                                                                           }
                case SC_ComboBoxListBoxPopup:
                default:
                    return baseStyle()->subControlRect(cc, opt, sc, w);
                }
            }

            QStyleOptionComboBox comboBox(*cb);
            comboBox.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &comboBox, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &comboBox, sc, w);
        }
        break;

#if QT_CONFIG(spinbox)
    case CC_SpinBox:
        if (const QStyleOptionSpinBox *spin = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            QRenderRule upRule = renderRule(w, opt, PseudoElement_SpinBoxUpButton);
            QRenderRule downRule = renderRule(w, opt, PseudoElement_SpinBoxDownButton);
            bool ruleMatch = rule.hasBox() || !rule.hasNativeBorder();
            bool upRuleMatch = upRule.hasGeometry() || upRule.hasPosition();
            bool downRuleMatch = downRule.hasGeometry() || downRule.hasPosition();
            if (ruleMatch || upRuleMatch || downRuleMatch) {
                switch (sc) {
                case SC_SpinBoxFrame:
                    return rule.borderRect(opt->rect);
                case SC_SpinBoxEditField:
                    {
                        QRect r = rule.contentsRect(opt->rect);
                        // Use the widest button on each side to determine edit field size.
                        Qt::Alignment upAlign, downAlign;

                        upAlign = upRule.hasPosition() ? upRule.position()->position
                                : Qt::Alignment(Qt::AlignRight);
                        upAlign = resolveAlignment(opt->direction, upAlign);

                        downAlign = downRule.hasPosition() ? downRule.position()->position
                                : Qt::Alignment(Qt::AlignRight);
                        downAlign = resolveAlignment(opt->direction, downAlign);

                        const bool hasButtons = (spin->buttonSymbols != QAbstractSpinBox::NoButtons);
                        const int upSize = hasButtons
                                ? subControlRect(CC_SpinBox, opt, SC_SpinBoxUp, w).width() : 0;
                        const int downSize = hasButtons
                                ? subControlRect(CC_SpinBox, opt, SC_SpinBoxDown, w).width() : 0;

                        int widestL = qMax((upAlign & Qt::AlignLeft) ? upSize : 0,
                                (downAlign & Qt::AlignLeft) ? downSize : 0);
                        int widestR = qMax((upAlign & Qt::AlignRight) ? upSize : 0,
                                (downAlign & Qt::AlignRight) ? downSize : 0);
                        r.setRight(r.right() - widestR);
                        r.setLeft(r.left() + widestL);
                        return r;
                    }
                case SC_SpinBoxDown:
                    if (downRuleMatch)
                        return positionRect(w, rule, downRule, PseudoElement_SpinBoxDownButton,
                                opt->rect, opt->direction);
                    break;
                case SC_SpinBoxUp:
                    if (upRuleMatch)
                        return positionRect(w, rule, upRule, PseudoElement_SpinBoxUpButton,
                                opt->rect, opt->direction);
                    break;
                default:
                    break;
                }

                return baseStyle()->subControlRect(cc, opt, sc, w);
            }

            QStyleOptionSpinBox spinBox(*spin);
            spinBox.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &spinBox, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &spinBox, sc, w);
        }
        break;
#endif // QT_CONFIG(spinbox)

    case CC_GroupBox:
        if (const QStyleOptionGroupBox *gb = qstyleoption_cast<const QStyleOptionGroupBox *>(opt)) {
            switch (sc) {
            case SC_GroupBoxFrame:
            case SC_GroupBoxContents: {
                if (rule.hasBox() || !rule.hasNativeBorder()) {
                    return sc == SC_GroupBoxFrame ? rule.borderRect(opt->rect)
                                                  : rule.contentsRect(opt->rect);
                }
                QStyleOptionGroupBox groupBox(*gb);
                groupBox.rect = rule.borderRect(opt->rect);
                return baseStyle()->subControlRect(cc, &groupBox, sc, w);
            }
            default:
            case SC_GroupBoxLabel:
            case SC_GroupBoxCheckBox: {
                QRenderRule indRule = renderRule(w, opt, PseudoElement_GroupBoxIndicator);
                QRenderRule labelRule = renderRule(w, opt, PseudoElement_GroupBoxTitle);
                if (!labelRule.hasPosition() && !labelRule.hasGeometry() && !labelRule.hasBox()
                    && !labelRule.hasBorder() && !indRule.hasContentsSize()) {
                    QStyleOptionGroupBox groupBox(*gb);
                    groupBox.rect = rule.borderRect(opt->rect);
                    return baseStyle()->subControlRect(cc, &groupBox, sc, w);
                }
                int tw = opt->fontMetrics.horizontalAdvance(gb->text);
                int th = opt->fontMetrics.height();
                int spacing = pixelMetric(QStyle::PM_CheckBoxLabelSpacing, opt, w);
                int iw = pixelMetric(QStyle::PM_IndicatorWidth, opt, w);
                int ih = pixelMetric(QStyle::PM_IndicatorHeight, opt, w);

                if (gb->subControls & QStyle::SC_GroupBoxCheckBox) {
                    tw = tw + iw + spacing;
                    th = qMax(th, ih);
                }
                if (!labelRule.hasGeometry()) {
                    labelRule.geo = new QStyleSheetGeometryData(tw, th, tw, th, -1, -1);
                } else {
                    labelRule.geo->width = tw;
                    labelRule.geo->height = th;
                }
                if (!labelRule.hasPosition()) {
                    labelRule.p = new QStyleSheetPositionData(0, 0, 0, 0, defaultOrigin(PseudoElement_GroupBoxTitle),
                                                              gb->textAlignment, PositionMode_Static);
                }
                QRect r = positionRect(w, rule, labelRule, PseudoElement_GroupBoxTitle,
                                      opt->rect, opt->direction);
                if (gb->subControls & SC_GroupBoxCheckBox) {
                    r = labelRule.contentsRect(r);
                    if (sc == SC_GroupBoxLabel) {
                        r.setLeft(r.left() + iw + spacing);
                        r.setTop(r.center().y() - th/2);
                    } else {
                        r = QRect(r.left(), r.center().y() - ih/2, iw, ih);
                    }
                    return r;
                } else {
                    return labelRule.contentsRect(r);
                }
            }
            } // switch
        }
        break;

    case CC_ToolButton:
        if (const QStyleOptionToolButton *tb = qstyleoption_cast<const QStyleOptionToolButton *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                switch (sc) {
                case SC_ToolButton: return rule.borderRect(opt->rect);
                case SC_ToolButtonMenu: {
                    QRenderRule subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
                    return positionRect(w, rule, subRule, PseudoElement_ToolButtonMenu, opt->rect, opt->direction);
                                                                            }
                default:
                    break;
                }
            }

            QStyleOptionToolButton tool(*tb);
            tool.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &tool, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &tool, sc, w);
            }
            break;

#if QT_CONFIG(scrollbar)
    case CC_ScrollBar:
        if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            QStyleOptionSlider styleOptionSlider(*sb);
            styleOptionSlider.rect = rule.borderRect(opt->rect);
            if (rule.hasDrawable() || rule.hasBox()) {
                QRect grooveRect;
                if (!rule.hasBox()) {
                    grooveRect = rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, sb, SC_ScrollBarGroove, w)
                                 : QWindowsStyle::subControlRect(cc, sb, SC_ScrollBarGroove, w);
                } else {
                    grooveRect = rule.contentsRect(opt->rect);
                }

                PseudoElement pe = PseudoElement_None;

                switch (sc) {
                case SC_ScrollBarGroove:
                    return grooveRect;
                case SC_ScrollBarAddPage:
                case SC_ScrollBarSubPage:
                case SC_ScrollBarSlider: {
                    QRect contentRect = grooveRect;
                    if (hasStyleRule(w, PseudoElement_ScrollBarSlider)) {
                        QRenderRule sliderRule = renderRule(w, opt, PseudoElement_ScrollBarSlider);
                        Origin origin = sliderRule.hasPosition() ? sliderRule.position()->origin : defaultOrigin(PseudoElement_ScrollBarSlider);
                        contentRect = rule.originRect(opt->rect, origin);
                    }
                    int maxlen = (styleOptionSlider.orientation == Qt::Horizontal) ? contentRect.width() : contentRect.height();
                    int sliderlen;
                    if (sb->maximum != sb->minimum) {
                        uint range = sb->maximum - sb->minimum;
                        sliderlen = (qint64(sb->pageStep) * maxlen) / (range + sb->pageStep);

                        int slidermin = pixelMetric(PM_ScrollBarSliderMin, sb, w);
                        if (sliderlen < slidermin || range > INT_MAX / 2)
                            sliderlen = slidermin;
                        if (sliderlen > maxlen)
                            sliderlen = maxlen;
                    } else {
                        sliderlen = maxlen;
                    }
                    int sliderstart = (styleOptionSlider.orientation == Qt::Horizontal ? contentRect.left() : contentRect.top())
                        + sliderPositionFromValue(sb->minimum, sb->maximum, sb->sliderPosition,
                                                  maxlen - sliderlen, sb->upsideDown);

                    QRect sr = (sb->orientation == Qt::Horizontal)
                               ? QRect(sliderstart, contentRect.top(), sliderlen, contentRect.height())
                               : QRect(contentRect.left(), sliderstart, contentRect.width(), sliderlen);
                    if (sc == SC_ScrollBarSubPage)
                        sr = QRect(contentRect.topLeft(), sb->orientation == Qt::Horizontal ? sr.bottomLeft() : sr.topRight());
                    else if (sc == SC_ScrollBarAddPage)
                        sr = QRect(sb->orientation == Qt::Horizontal ? sr.topRight() : sr.bottomLeft(), contentRect.bottomRight());
                    return visualRect(styleOptionSlider.direction, grooveRect, sr);
                }
                case SC_ScrollBarAddLine: pe = PseudoElement_ScrollBarAddLine; break;
                case SC_ScrollBarSubLine: pe = PseudoElement_ScrollBarSubLine; break;
                case SC_ScrollBarFirst: pe = PseudoElement_ScrollBarFirst;  break;
                case SC_ScrollBarLast: pe = PseudoElement_ScrollBarLast; break;
                default: break;
                }
                if (hasStyleRule(w,pe)) {
                    QRenderRule subRule = renderRule(w, opt, pe);
                    if (subRule.hasPosition() || subRule.hasGeometry() || subRule.hasBox()) {
                        const QStyleSheetPositionData *pos = subRule.position();
                        QRect originRect = grooveRect;
                        if (rule.hasBox()) {
                            Origin origin = (pos && pos->origin != Origin_Unknown) ? pos->origin : defaultOrigin(pe);
                            originRect = rule.originRect(opt->rect, origin);
                        }
                        return positionRect(w, subRule, pe, originRect, styleOptionSlider.direction);
                    }
                }
            }
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &styleOptionSlider, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &styleOptionSlider, sc, w);
        }
        break;
#endif // QT_CONFIG(scrollbar)

#if QT_CONFIG(slider)
    case CC_Slider:
        if (const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_SliderGroove);
            if (!subRule.hasDrawable())
                break;
            subRule.img = nullptr;
            QRect gr = positionRect(w, rule, subRule, PseudoElement_SliderGroove, opt->rect, opt->direction);
            switch (sc) {
            case SC_SliderGroove:
                return gr;
            case SC_SliderHandle: {
                bool horizontal = slider->orientation & Qt::Horizontal;
                QRect cr = subRule.contentsRect(gr);
                QRenderRule subRule2 = renderRule(w, opt, PseudoElement_SliderHandle);
                int len = horizontal ? subRule2.size().width() : subRule2.size().height();
                subRule2.img = nullptr;
                subRule2.geo = nullptr;
                cr = positionRect(w, subRule2, PseudoElement_SliderHandle, cr, opt->direction);
                int thickness = horizontal ? cr.height() : cr.width();
                int sliderPos = sliderPositionFromValue(slider->minimum, slider->maximum, slider->sliderPosition,
                                                        (horizontal ? cr.width() : cr.height()) - len, slider->upsideDown);
                cr = horizontal ? QRect(cr.x() + sliderPos, cr.y(), len, thickness)
                                  : QRect(cr.x(), cr.y() + sliderPos, thickness, len);
                return subRule2.borderRect(cr);
                break; }
            case SC_SliderTickmarks:
                // TODO...
            default:
                break;
            }
        }
        break;
#endif // QT_CONFIG(slider)

    case CC_MdiControls:
        if (hasStyleRule(w, PseudoElement_MdiCloseButton)
            || hasStyleRule(w, PseudoElement_MdiNormalButton)
            || hasStyleRule(w, PseudoElement_MdiMinButton)) {
            QList<QVariant> layout = rule.styleHint("button-layout"_L1).toList();
            if (layout.isEmpty())
                layout = subControlLayout("mNX");

            int x = 0, width = 0;
            QRenderRule subRule;
            for (const QVariant &val : std::as_const(layout)) {
                int layoutButton = val.toInt();
                if (layoutButton < PseudoElement_MdiCloseButton
                    || layoutButton > PseudoElement_MdiNormalButton)
                    continue;
                QStyle::SubControl control = knownPseudoElements[layoutButton].subControl;
                if (!(opt->subControls & control))
                    continue;
                subRule = renderRule(w, opt, layoutButton);
                width = subRule.size().width();
                if (sc == control)
                    break;
                x += width;
            }

            return subRule.borderRect(QRect(x, opt->rect.top(), width, opt->rect.height()));
        }
        break;

    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
            if (!subRule.hasDrawable() && !subRule.hasBox() && !subRule.hasBorder())
                break;
            QHash<QStyle::SubControl, QRect> layoutRects = titleBarLayout(w, tb);
            return layoutRects.value(sc);
        }
        break;

    default:
        break;
    }

    return baseStyle()->subControlRect(cc, opt, sc, w);
}